

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

int32_t __thiscall wasm::BinaryInstWriter::getBreakIndex(BinaryInstWriter *this,Name name)

{
  pointer pNVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  pNVar1 = (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1;
  if (DAT_010d2868 == name.super_IString.str._M_str) {
    iVar2 = (int)(uVar3 >> 4);
  }
  else {
    uVar3 = uVar3 >> 4 & 0xffffffff;
    iVar2 = -1;
    do {
      uVar3 = uVar3 - 1;
      uVar4 = (uint)uVar3;
      if ((int)uVar4 < 0) break;
      iVar2 = iVar2 + 1;
    } while (pNVar1[uVar4 & 0x7fffffff].super_IString.str._M_str != name.super_IString.str._M_str);
    if ((int)uVar4 < 0) {
      handle_unreachable("break index not found",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xc04);
    }
  }
  return iVar2;
}

Assistant:

int32_t BinaryInstWriter::getBreakIndex(Name name) { // -1 if not found
  if (name == DELEGATE_CALLER_TARGET) {
    return breakStack.size();
  }
  for (int i = breakStack.size() - 1; i >= 0; i--) {
    if (breakStack[i] == name) {
      return breakStack.size() - 1 - i;
    }
  }
  WASM_UNREACHABLE("break index not found");
}